

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O2

void CRYPTO_poly1305_update(poly1305_state *state,uint8_t *m,size_t bytes)

{
  uint64_t uVar1;
  ulong uVar2;
  poly1305_state_internal *st;
  
  if (bytes != 0) {
    st = (poly1305_state_internal *)((ulong)(*state + 0x3f) & 0xffffffffffffffc0);
    if (st->started == 0) {
      uVar1 = st->leftover;
      if ((bytes < 0x21) || (uVar1 != 0)) {
        uVar2 = -(uVar1 - 0x20);
        if (bytes <= -(uVar1 - 0x20)) {
          uVar2 = bytes;
        }
        if (uVar1 == 0x20) {
          uVar1 = 0x20;
        }
        else {
          memcpy(st->buffer + uVar1,m,uVar2);
          uVar1 = st->leftover;
        }
        st->leftover = uVar1 + uVar2;
        bytes = bytes - uVar2;
        if (bytes == 0) {
          return;
        }
        if (uVar1 + uVar2 < 0x20) {
          return;
        }
        m = m + uVar2;
        poly1305_first_block(st,st->buffer);
        st->leftover = 0;
      }
      else {
        poly1305_first_block(st,m);
        m = m + 0x20;
        bytes = bytes - 0x20;
      }
      st->started = 1;
    }
    uVar1 = st->leftover;
    if (uVar1 != 0) {
      uVar2 = 0x40 - uVar1;
      if (bytes <= 0x40 - uVar1) {
        uVar2 = bytes;
      }
      if (uVar2 != 0) {
        memcpy(st->buffer + uVar1,m,uVar2);
        uVar1 = st->leftover;
      }
      st->leftover = uVar1 + uVar2;
      if (uVar1 + uVar2 < 0x40) {
        return;
      }
      m = m + uVar2;
      bytes = bytes - uVar2;
      poly1305_blocks(st,st->buffer,0x40);
      st->leftover = 0;
    }
    if (0x3f < bytes) {
      poly1305_blocks(st,m,bytes & 0xffffffffffffffc0);
      m = m + (bytes & 0xffffffffffffffc0);
      bytes = (size_t)((uint)bytes & 0x3f);
    }
    if (bytes != 0) {
      memcpy(st->buffer + st->leftover,m,bytes);
      st->leftover = st->leftover + bytes;
    }
  }
  return;
}

Assistant:

void CRYPTO_poly1305_update(poly1305_state *state, const uint8_t *m,
                            size_t bytes) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  size_t want;

  // Work around a C language bug. See https://crbug.com/1019588.
  if (bytes == 0) {
    return;
  }

  // need at least 32 initial bytes to start the accelerated branch
  if (!st->started) {
    if ((st->leftover == 0) && (bytes > 32)) {
      poly1305_first_block(st, m);
      m += 32;
      bytes -= 32;
    } else {
      want = poly1305_min(32 - st->leftover, bytes);
      OPENSSL_memcpy(st->buffer + st->leftover, m, want);
      bytes -= want;
      m += want;
      st->leftover += want;
      if ((st->leftover < 32) || (bytes == 0)) {
        return;
      }
      poly1305_first_block(st, st->buffer);
      st->leftover = 0;
    }
    st->started = 1;
  }

  // handle leftover
  if (st->leftover) {
    want = poly1305_min(64 - st->leftover, bytes);
    OPENSSL_memcpy(st->buffer + st->leftover, m, want);
    bytes -= want;
    m += want;
    st->leftover += want;
    if (st->leftover < 64) {
      return;
    }
    poly1305_blocks(st, st->buffer, 64);
    st->leftover = 0;
  }

  // process 64 byte blocks
  if (bytes >= 64) {
    want = (bytes & ~63);
    poly1305_blocks(st, m, want);
    m += want;
    bytes -= want;
  }

  if (bytes) {
    OPENSSL_memcpy(st->buffer + st->leftover, m, bytes);
    st->leftover += bytes;
  }
}